

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O1

void VP8LCreateHuffmanTree
               (uint32_t *histogram,int tree_depth_limit,uint8_t *buf_rle,HuffmanTree *huff_tree,
               HuffmanTreeCode *huff_code)

{
  HuffmanTree *pHVar1;
  uint32_t *puVar2;
  byte bVar3;
  byte *bit_depths;
  uint8_t *puVar4;
  uint16_t *puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  HuffmanTree *pool;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  HuffmanTree *pHVar19;
  size_t __n;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  uint32_t uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint32_t next_code [16];
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78 [18];
  
  uVar26 = huff_code->num_symbols;
  memset(buf_rle,0,(long)(int)uVar26);
  uVar10 = (ulong)uVar26;
  uVar27 = uVar26;
  if ((long)(int)uVar26 < 0) {
LAB_001410b1:
    if (-1 < (int)uVar27) {
      uVar23 = *histogram;
      uVar22 = (ulong)uVar27;
      uVar11 = 0;
      __n = 0;
      do {
        iVar25 = (int)__n;
        if ((uVar22 == uVar11) || (histogram[uVar11] != uVar23)) {
          if ((uVar23 == 0 && 4 < iVar25) || (6 < iVar25 && uVar23 != 0)) {
            if (iVar25 < 2) {
              __n = 1;
            }
            memset(buf_rle + uVar11 + (-1 - (ulong)((int)__n - 1)),1,__n);
          }
          __n = 1;
          if (uVar22 != uVar11) {
            uVar23 = histogram[uVar11];
          }
        }
        else {
          __n = (size_t)(iVar25 + 1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar27 + 1 != uVar11);
      if (-1 < (int)uVar27) {
        uVar11 = (ulong)*histogram;
        uVar28 = 0;
        iVar25 = 0;
        uVar24 = 0;
        do {
          uVar21 = (uint)uVar24;
          if (((uVar28 == uVar22) || (buf_rle[uVar28] != '\0')) ||
             ((uVar28 != 0 && (buf_rle[uVar28 - 1] != '\0')))) {
LAB_00141188:
            if ((3 < uVar21) || ((uVar21 == 3 && (iVar25 == 0)))) {
              uVar16 = (int)(uVar24 >> 1) + iVar25;
              uVar23 = (uint32_t)(uVar16 / uVar24);
              if (uVar16 < uVar21) {
                uVar23 = 1;
              }
              if (iVar25 == 0) {
                uVar23 = 0;
              }
              lVar14 = -1;
              do {
                histogram[(uint)((int)uVar28 + (int)lVar14)] = uVar23;
                lVar20 = (ulong)(uVar21 + (uVar21 == 0)) + lVar14;
                lVar14 = lVar14 + -1;
              } while (lVar20 != 0);
            }
            if ((long)uVar28 < (long)(int)(uVar27 - 3)) {
              puVar2 = histogram + uVar28;
              uVar11 = (ulong)(puVar2[3] + puVar2[1] + puVar2[2] + *puVar2 + 2 >> 2);
            }
            else if (uVar28 < uVar22) {
              uVar11 = (ulong)histogram[uVar28];
            }
            else {
              uVar11 = 0;
            }
            uVar21 = 0;
            iVar25 = 0;
          }
          else {
            uVar17 = histogram[uVar28] - (int)uVar11;
            uVar16 = -uVar17;
            if (0 < (int)uVar17) {
              uVar16 = uVar17;
            }
            if (3 < uVar16) goto LAB_00141188;
          }
          uVar21 = uVar21 + 1;
          uVar24 = (ulong)uVar21;
          if ((uVar28 != uVar22) && (iVar25 = iVar25 + histogram[uVar28], 3 < uVar21)) {
            uVar11 = ((uVar21 >> 1) + iVar25) / uVar24;
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar27 + 1);
      }
    }
  }
  else {
    for (; uVar27 != 0; uVar27 = uVar27 - 1) {
      if (histogram[(ulong)uVar27 - 1] != 0) goto LAB_001410b1;
    }
  }
  if ((int)uVar26 < 1) {
    uVar22 = 0;
  }
  else {
    uVar11 = 0;
    uVar22 = 0;
    do {
      uVar22 = (ulong)(((int)uVar22 + 1) - (uint)(histogram[uVar11] == 0));
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  iVar25 = (int)uVar22;
  if (iVar25 != 0) {
    bit_depths = huff_code->code_lengths;
    pool = huff_tree + iVar25;
    local_c0 = huff_tree + -1;
    uVar27 = 1;
    do {
      if (0 < (int)uVar26) {
        uVar11 = 0;
        iVar18 = 0;
        do {
          uVar21 = histogram[uVar11];
          if (uVar21 != 0) {
            if (uVar21 <= uVar27) {
              uVar21 = uVar27;
            }
            huff_tree[iVar18].total_count_ = uVar21;
            huff_tree[iVar18].value_ = (int)uVar11;
            huff_tree[iVar18].pool_index_left_ = -1;
            huff_tree[iVar18].pool_index_right_ = -1;
            iVar18 = iVar18 + 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      qsort(huff_tree,(long)iVar25,0x10,CompareHuffmanTrees);
      if (iVar25 < 2) {
        if (iVar25 == 1) {
          bit_depths[huff_tree->value_] = 1;
        }
      }
      else {
        uVar11 = 0;
        uVar28 = (ulong)(iVar25 - 2);
        uVar24 = uVar22;
        do {
          uVar29 = uVar11 | 1;
          pHVar19 = local_c0 + uVar24;
          iVar18 = pHVar19->value_;
          iVar8 = pHVar19->pool_index_left_;
          iVar9 = pHVar19->pool_index_right_;
          pHVar1 = pool + uVar11;
          pHVar1->total_count_ = pHVar19->total_count_;
          pHVar1->value_ = iVar18;
          pHVar1->pool_index_left_ = iVar8;
          pHVar1->pool_index_right_ = iVar9;
          pHVar19 = huff_tree + (uVar24 - 2);
          iVar18 = pHVar19->value_;
          iVar8 = pHVar19->pool_index_left_;
          iVar9 = pHVar19->pool_index_right_;
          pHVar1 = pool + uVar29;
          pHVar1->total_count_ = pHVar19->total_count_;
          pHVar1->value_ = iVar18;
          pHVar1->pool_index_left_ = iVar8;
          pHVar1->pool_index_right_ = iVar9;
          uVar21 = pool[uVar11].total_count_ + pool[uVar29].total_count_;
          uVar13 = 0;
          if (2 < (long)uVar24) {
            uVar12 = 0;
            pHVar19 = huff_tree;
            do {
              uVar13 = uVar12;
              if (pHVar19->total_count_ <= uVar21) break;
              uVar12 = uVar12 + 1;
              pHVar19 = pHVar19 + 1;
              uVar13 = uVar28;
            } while (uVar28 != uVar12);
          }
          pHVar19 = huff_tree + (uVar13 & 0xffffffff);
          memmove(pHVar19 + 1,huff_tree + (uVar13 & 0xffffffff),
                  ((uVar24 - 2) - (long)(int)uVar13) * 0x10);
          pHVar19->total_count_ = uVar21;
          pHVar19->value_ = -1;
          pHVar19->pool_index_left_ = (int)uVar29;
          pHVar19->pool_index_right_ = (int)uVar11;
          uVar28 = uVar28 - 1;
          bVar6 = 2 < (long)uVar24;
          uVar11 = uVar11 + 2;
          uVar24 = uVar24 - 1;
        } while (bVar6);
        SetBitDepths(huff_tree,pool,bit_depths,0);
      }
      uVar21 = (uint)*bit_depths;
      if (1 < (int)uVar26) {
        uVar11 = 1;
        uVar21 = (uint)*bit_depths;
        do {
          if (uVar21 <= bit_depths[uVar11]) {
            uVar21 = (uint)bit_depths[uVar11];
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar27 = uVar27 * 2;
    } while (tree_depth_limit < (int)uVar21);
  }
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  iVar25 = huff_code->num_symbols;
  lVar14 = (long)iVar25;
  if (0 < lVar14) {
    puVar4 = huff_code->code_lengths;
    lVar20 = 0;
    do {
      *(int *)(local_b8 + (ulong)puVar4[lVar20] * 4) =
           *(int *)(local_b8 + (ulong)puVar4[lVar20] * 4) + 1;
      lVar20 = lVar20 + 1;
    } while (lVar14 != lVar20);
  }
  uVar26 = 0;
  auVar7._12_4_ = 0;
  auVar7._0_12_ = local_b8._4_12_;
  local_b8 = auVar7 << 0x20;
  local_78[0] = 0;
  lVar20 = 1;
  do {
    uVar26 = (uVar26 + *(int *)(local_b8 + lVar20 * 4 + -4)) * 2;
    local_78[lVar20] = uVar26;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x10);
  if (0 < iVar25) {
    puVar4 = huff_code->code_lengths;
    puVar5 = huff_code->codes;
    lVar20 = 0;
    do {
      bVar3 = puVar4[lVar20];
      uVar26 = local_78[bVar3];
      local_78[bVar3] = uVar26 + 1;
      uVar27 = 0;
      if (bVar3 != 0) {
        uVar21 = 0;
        bVar15 = 0xc;
        uVar27 = 0;
        do {
          uVar21 = uVar21 + 4;
          uVar27 = uVar27 | (uint)""[uVar26 & 0xf] << (bVar15 & 0x1f);
          uVar26 = uVar26 >> 4;
          bVar15 = bVar15 - 4;
        } while (uVar21 < bVar3);
      }
      puVar5[lVar20] = (uint16_t)(uVar27 >> (0x10 - bVar3 & 0x1f));
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar14);
  }
  return;
}

Assistant:

void VP8LCreateHuffmanTree(uint32_t* const histogram, int tree_depth_limit,
                           uint8_t* const buf_rle, HuffmanTree* const huff_tree,
                           HuffmanTreeCode* const huff_code) {
  const int num_symbols = huff_code->num_symbols;
  memset(buf_rle, 0, num_symbols * sizeof(*buf_rle));
  OptimizeHuffmanForRle(num_symbols, buf_rle, histogram);
  GenerateOptimalTree(histogram, num_symbols, huff_tree, tree_depth_limit,
                      huff_code->code_lengths);
  // Create the actual bit codes for the bit lengths.
  ConvertBitDepthsToSymbols(huff_code);
}